

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O1

void test_bool(void)

{
  char cVar1;
  char extraout_AL;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined8 in_RAX;
  undefined8 uVar6;
  undefined8 uVar7;
  long extraout_RAX;
  char *extraout_RAX_00;
  char *extraout_RAX_01;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  void *pvVar11;
  void *pvVar12;
  int extraout_var;
  long extraout_RAX_02;
  undefined8 extraout_RAX_03;
  undefined8 extraout_RAX_04;
  bson_t *bson;
  char *__buf;
  char *__n;
  char *pcVar13;
  char *pcVar14;
  size_t sVar15;
  size_t sVar16;
  DIR *__dirp;
  dirent *pdVar17;
  FILE *__stream;
  long lVar18;
  uint extraout_EDX;
  char *__dest;
  ulong uVar19;
  char *pcVar20;
  DIR *__s;
  DIR *__name;
  char *pcVar21;
  DIR *pDVar22;
  DIR *__filename;
  undefined8 uVar23;
  DIR *pDVar24;
  undefined1 *puVar25;
  char *pcVar26;
  char *pcVar27;
  char *__n_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  _Bool b;
  undefined1 auStack_7618 [8];
  undefined1 auStack_7610 [504];
  ulong uStack_7418;
  DIR *pDStack_7410;
  char *pcStack_7408;
  DIR *pDStack_7400;
  DIR *pDStack_73f8;
  int iStack_73ec;
  DIR *pDStack_73e8;
  stat sStack_73e0;
  char acStack_7350 [512];
  size_t sStack_7150;
  char *pcStack_7148;
  DIR *pDStack_7140;
  char *pcStack_7138;
  code *pcStack_7130;
  char *pcStack_7128;
  ulong uStack_7120;
  char *pcStack_7118;
  DIR *pDStack_7110;
  undefined8 *puStack_7108;
  undefined8 uStack_70d0;
  undefined1 *puStack_70c8;
  undefined1 *puStack_70c0;
  undefined1 auStack_70b0 [8];
  char *pcStack_70a8;
  undefined8 uStack_7098;
  char *pcStack_7090;
  undefined8 uStack_7088;
  undefined8 uStack_7070;
  DIR aDStack_7000 [25944];
  char *pcStack_aa8;
  char *pcStack_aa0;
  char *pcStack_a98;
  char *pcStack_a90;
  code *apcStack_a88 [2];
  undefined1 auStack_a78 [116];
  uint uStack_a04;
  char acStack_a00 [256];
  undefined8 uStack_900;
  char *pcStack_8f8;
  char *pcStack_8f0;
  char *pcStack_8e8;
  char *pcStack_8e0;
  char *pcStack_8d8;
  char *pcStack_8d0;
  undefined8 uStack_8c8;
  code *pcStack_8c0;
  char *pcStack_8b8;
  undefined8 uStack_8b0;
  char *pcStack_8a8;
  char *pcStack_8a0;
  char *pcStack_898;
  char *pcStack_890;
  code *pcStack_888;
  undefined8 uStack_880;
  undefined8 uStack_878;
  char *pcStack_870;
  char *pcStack_868;
  char *pcStack_860;
  undefined8 uStack_858;
  bson_t *pbStack_850;
  char *pcStack_848;
  code *pcStack_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  char *pcStack_820;
  char *pcStack_818;
  char *pcStack_810;
  char *pcStack_808;
  char *pcStack_800;
  code *pcStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 uStack_7e0;
  undefined1 *puStack_7d8;
  char *pcStack_7d0;
  char *pcStack_7c8;
  code *pcStack_7c0;
  undefined8 uStack_7b8;
  ulong uStack_7b0;
  ulong uStack_7a8;
  undefined1 *puStack_7a0;
  char *pcStack_798;
  void *pvStack_790;
  code *pcStack_788;
  uint uStack_704;
  undefined1 auStack_700 [4];
  uint uStack_6fc;
  ulong uStack_5b0;
  ulong uStack_5a8;
  undefined1 *puStack_5a0;
  char *pcStack_598;
  void *pvStack_590;
  code *apcStack_588 [16];
  uint uStack_504;
  undefined1 auStack_500 [4];
  uint uStack_4fc;
  undefined8 uStack_3b8;
  ulong uStack_3b0;
  undefined1 *puStack_3a8;
  char *pcStack_3a0;
  undefined8 uStack_398;
  code *apcStack_390 [2];
  undefined8 uStack_380;
  code *pcStack_378;
  undefined8 uStack_368;
  code *pcStack_360;
  long lStack_358;
  undefined8 uStack_350;
  code *pcStack_348;
  undefined8 uStack_340;
  int iStack_338;
  int iStack_334;
  undefined8 uStack_330;
  char *pcStack_328;
  code *pcStack_320;
  int iStack_314;
  ulong uStack_310;
  code *pcStack_308;
  undefined8 uStack_300;
  uint uStack_28c;
  char *pcStack_288;
  undefined1 auStack_280 [4];
  uint uStack_27c;
  undefined8 uStack_128;
  char *pcStack_f8;
  undefined8 uStack_f0;
  code *pcStack_e8;
  char *pcStack_e0;
  undefined8 uStack_d8;
  code *pcStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_b8;
  char *pcStack_b0;
  undefined1 auStack_a4 [12];
  undefined8 uStack_98;
  char *pcStack_90;
  code *pcStack_88;
  undefined8 uStack_80;
  char *pcStack_70;
  char *pcStack_68;
  undefined8 uStack_60;
  char *pcStack_58;
  long lStack_30;
  undefined8 uStack_28;
  code *pcStack_20;
  char local_11;
  
  local_11 = (char)((ulong)in_RAX >> 0x38);
  pcStack_20 = (code *)0x13b74f;
  uVar6 = bson_bcon_magic();
  pcStack_20 = (code *)0x13b773;
  uVar6 = bcon_new(0,"foo",uVar6,7,1,0);
  pcStack_20 = (code *)0x13b77b;
  uVar7 = bson_bcone_magic();
  pcStack_20 = (code *)0x13b798;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,7,&local_11,0);
  if (cVar1 == '\0') {
    pcStack_20 = (code *)0x13b7b8;
    test_bool_cold_1();
  }
  else if (local_11 != '\0') {
    pcStack_20 = (code *)0x13b7ab;
    bson_destroy(uVar6);
    return;
  }
  pcStack_20 = test_date_time;
  test_bool_cold_2();
  pcStack_20 = (code *)0x13e3df;
  lStack_30 = extraout_RAX;
  uStack_28 = uVar6;
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,8,10000,0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,8,&lStack_30,0);
  if (cVar1 == '\0') {
    test_date_time_cold_1();
  }
  else if (lStack_30 == 10000) {
    bson_destroy(uVar6);
    return;
  }
  test_date_time_cold_2();
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,9,0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,9,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  test_null_cold_1();
  pcStack_58 = "foo";
  pcStack_88 = (code *)0x13b8a2;
  uStack_60 = uVar6;
  uVar6 = bson_bcon_magic();
  uStack_80 = 0;
  pcStack_88 = (code *)0x13b8d2;
  uVar6 = bcon_new(0,"foo",uVar6,10,"^foo|bar$","i");
  pcStack_88 = (code *)0x13b8da;
  uVar7 = bson_bcone_magic();
  uStack_80 = 0;
  pcStack_88 = (code *)0x13b8fd;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,10,&pcStack_68,&pcStack_70);
  if (cVar1 == '\0') {
    pcStack_88 = (code *)0x13b942;
    test_regex_cold_1();
LAB_0013b942:
    pcStack_88 = (code *)0x13b947;
    test_regex_cold_2();
  }
  else {
    pcStack_88 = (code *)0x13b912;
    iVar2 = strcmp(pcStack_68,"^foo|bar$");
    if (iVar2 != 0) goto LAB_0013b942;
    pcStack_88 = (code *)0x13b927;
    iVar2 = strcmp(pcStack_70,"i");
    if (iVar2 == 0) {
      pcStack_88 = (code *)0x13b933;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_88 = test_dbpointer;
  test_regex_cold_3();
  pcStack_88 = (code *)0x0;
  pcStack_90 = "foo";
  pcStack_d0 = (code *)0x13b967;
  uStack_98 = uVar6;
  bson_oid_init(auStack_a4,0);
  pcStack_d0 = (code *)0x13b96c;
  uVar6 = bson_bcon_magic();
  uStack_c8 = 0;
  pcStack_d0 = (code *)0x13b995;
  uVar6 = bcon_new(0,"foo",uVar6,0xb,"collection",auStack_a4);
  pcStack_d0 = (code *)0x13b99d;
  uVar7 = bson_bcone_magic();
  uStack_c8 = 0;
  pcStack_d0 = (code *)0x13b9c0;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xb,&pcStack_b0,&uStack_b8);
  if (cVar1 == '\0') {
    pcStack_d0 = (code *)0x13ba03;
    test_dbpointer_cold_1();
LAB_0013ba03:
    pcStack_d0 = (code *)0x13ba08;
    test_dbpointer_cold_2();
  }
  else {
    pcStack_d0 = (code *)0x13b9d5;
    iVar2 = strcmp(pcStack_b0,"collection");
    if (iVar2 != 0) goto LAB_0013ba03;
    pcStack_d0 = (code *)0x13b9e8;
    cVar1 = bson_oid_equal(uStack_b8,auStack_a4);
    if (cVar1 != '\0') {
      pcStack_d0 = (code *)0x13b9f4;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_d0 = test_code;
  test_dbpointer_cold_3();
  pcStack_d0 = (code *)0x13e3df;
  pcStack_e8 = (code *)0x13ba16;
  pcStack_e0 = extraout_RAX_00;
  uStack_d8 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_e8 = (code *)0x13ba3b;
  uVar6 = bcon_new(0,"foo",uVar6,0xc,"var a = {};",0);
  pcStack_e8 = (code *)0x13ba43;
  uVar7 = bson_bcone_magic();
  pcStack_e8 = (code *)0x13ba5e;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xc,&pcStack_e0,0);
  if (cVar1 == '\0') {
    pcStack_e8 = (code *)0x13ba8b;
    test_code_cold_1();
  }
  else {
    pcStack_e8 = (code *)0x13ba72;
    iVar2 = strcmp(pcStack_e0,"var a = {};");
    if (iVar2 == 0) {
      pcStack_e8 = (code *)0x13ba7e;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_e8 = test_symbol;
  test_code_cold_2();
  pcStack_e8 = (code *)0x13e3df;
  pcStack_f8 = extraout_RAX_01;
  uStack_f0 = uVar6;
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,0xd,"symbol",0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xd,&pcStack_f8,0);
  if (cVar1 == '\0') {
    test_symbol_cold_1();
  }
  else {
    iVar2 = strcmp(pcStack_f8,"symbol");
    if (iVar2 == 0) {
      bson_destroy(uVar6);
      return;
    }
  }
  test_symbol_cold_2();
  pcStack_308 = (code *)0x13bb30;
  uStack_128 = uVar6;
  pvVar8 = (void *)bson_bcon_magic();
  puVar25 = (undefined1 *)0x0;
  pcStack_308 = (code *)0x13bb57;
  uVar9 = bcon_new(0,"b",pvVar8,0xf,10,0);
  uStack_300 = 0;
  pcVar27 = "foo";
  pcStack_308 = (code *)0x13bb83;
  uVar10 = bcon_new(0,"foo",pvVar8,0xe,"var a = b;",uVar9);
  pcStack_308 = (code *)0x13bb8b;
  uVar6 = bson_bcone_magic();
  uStack_300 = 0;
  pcStack_308 = (code *)0x13bbb1;
  cVar1 = bcon_extract(uVar10,"foo",uVar6,0xe,&pcStack_288,auStack_280);
  if (cVar1 == '\0') {
LAB_0013bd4d:
    pcStack_308 = (code *)0x13bd52;
    test_codewscope_cold_1();
LAB_0013bd52:
    pcStack_308 = (code *)0x13bd57;
    test_codewscope_cold_2();
LAB_0013bd57:
    pcStack_308 = (code *)0x13bd5c;
    test_codewscope_cold_7();
LAB_0013bd5c:
    pcStack_308 = (code *)0x13bd61;
    test_codewscope_cold_6();
LAB_0013bd61:
    pcStack_308 = (code *)0x13bd66;
    test_codewscope_cold_3();
  }
  else {
    pcStack_308 = (code *)0x13bbca;
    iVar2 = strcmp(pcStack_288,"var a = b;");
    if (iVar2 != 0) goto LAB_0013bd52;
    pcStack_308 = (code *)0x13bbe2;
    pcVar27 = (char *)bson_get_data(auStack_280);
    pcStack_308 = (code *)0x13bbed;
    pvVar8 = (void *)bson_get_data(uVar9);
    if (*(uint *)(uVar9 + 4) == uStack_27c) {
      pcStack_308 = (code *)0x13bc01;
      pvVar11 = (void *)bson_get_data(uVar9);
      pcStack_308 = (code *)0x13bc11;
      pvVar12 = (void *)bson_get_data(auStack_280);
      pcStack_308 = (code *)0x13bc1f;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar9 + 4));
      if (iVar2 == 0) {
        pcStack_308 = (code *)0x13bc30;
        bson_destroy(auStack_280);
        pcStack_308 = (code *)0x13bc38;
        bson_destroy(uVar9);
        pcStack_308 = (code *)0x13bc40;
        bson_destroy(uVar10);
        return;
      }
    }
    puVar25 = auStack_280;
    pcStack_308 = (code *)0x13bc61;
    uVar6 = bson_as_canonical_extended_json(puVar25);
    pcStack_308 = (code *)0x13bc6e;
    uVar7 = bson_as_canonical_extended_json(uVar9);
    uVar10 = 0xffffffff;
    if (uStack_27c != 0) {
      uVar19 = 0;
      do {
        if (*(int *)(uVar9 + 4) == (int)uVar19) break;
        if (pcVar27[uVar19] != *(char *)((long)pvVar8 + uVar19)) {
          uVar10 = uVar19 & 0xffffffff;
          break;
        }
        uVar19 = uVar19 + 1;
      } while (uStack_27c != (uint)uVar19);
    }
    if ((int)uVar10 == -1) {
      uVar3 = uStack_27c;
      if (uStack_27c < *(uint *)(uVar9 + 4)) {
        uVar3 = *(uint *)(uVar9 + 4);
      }
      uVar10 = (ulong)(uVar3 - 1);
    }
    pcStack_308 = (code *)0x13bcc9;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar10,uVar6,uVar7);
    pcStack_308 = (code *)0x13bce1;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    uVar10 = (ulong)uVar3;
    pcStack_308 = (code *)0x13bcfc;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_28c = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013bd57;
    puVar25 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013bd5c;
    uVar10 = (ulong)uStack_27c;
    pcStack_308 = (code *)0x13bd26;
    uVar19 = write(uVar3,pcVar27,uVar10);
    if (uVar19 != uVar10) goto LAB_0013bd61;
    uVar9 = (ulong)*(uint *)(uVar9 + 4);
    pcStack_308 = (code *)0x13bd3c;
    uVar19 = write(uVar4,pvVar8,uVar9);
    if (uVar19 == uVar9) {
      pcStack_308 = (code *)0x13bd4d;
      test_codewscope_cold_5();
      goto LAB_0013bd4d;
    }
  }
  pcStack_308 = test_int32;
  test_codewscope_cold_4();
  pcStack_320 = (code *)0x13bd74;
  uStack_310 = uVar9;
  pcStack_308 = (code *)pvVar8;
  iStack_314 = extraout_var;
  uVar6 = bson_bcon_magic();
  pcStack_320 = (code *)0x13bd98;
  uVar6 = bcon_new(0,"foo",uVar6,0xf,10,0);
  pcStack_320 = (code *)0x13bda0;
  uVar7 = bson_bcone_magic();
  pcStack_320 = (code *)0x13bdbd;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0xf,&iStack_314,0);
  if (cVar1 == '\0') {
    pcStack_320 = (code *)0x13bddd;
    test_int32_cold_1();
  }
  else if (iStack_314 == 10) {
    pcStack_320 = (code *)0x13bdd0;
    bson_destroy(uVar6);
    return;
  }
  pcStack_320 = test_timestamp;
  test_int32_cold_2();
  pcStack_328 = "foo";
  pcStack_348 = (code *)0x13bdf0;
  uStack_330 = uVar6;
  pcStack_320 = (code *)pcVar27;
  uVar6 = bson_bcon_magic();
  pvVar8 = (void *)0x0;
  uStack_340 = 0;
  pcStack_348 = (code *)0x13be1e;
  uVar6 = bcon_new(0,"foo",uVar6,0x10,100,1000);
  pcStack_348 = (code *)0x13be26;
  uVar7 = bson_bcone_magic();
  uStack_340 = 0;
  pcStack_348 = (code *)0x13be49;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x10,&iStack_334,&iStack_338);
  if (cVar1 == '\0') {
    pcStack_348 = (code *)0x13be75;
    test_timestamp_cold_1();
LAB_0013be75:
    pcStack_348 = (code *)0x13be7a;
    test_timestamp_cold_2();
  }
  else {
    if (iStack_334 != 100) goto LAB_0013be75;
    if (iStack_338 == 1000) {
      pcStack_348 = (code *)0x13be66;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_348 = test_int64;
  test_timestamp_cold_3();
  pcStack_348 = (code *)0x13e3df;
  pcStack_360 = (code *)0x13be88;
  lStack_358 = extraout_RAX_02;
  uStack_350 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_360 = (code *)0x13beac;
  uVar6 = bcon_new(0,"foo",uVar6,0x11,10,0);
  pcStack_360 = (code *)0x13beb4;
  uVar7 = bson_bcone_magic();
  pcStack_360 = (code *)0x13becf;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x11,&lStack_358,0);
  if (cVar1 == '\0') {
    pcStack_360 = (code *)0x13beef;
    test_int64_cold_1();
  }
  else if (lStack_358 == 10) {
    pcStack_360 = (code *)0x13bee2;
    bson_destroy(uVar6);
    return;
  }
  pcStack_360 = test_maxkey;
  test_int64_cold_2();
  pcStack_360 = (code *)0x13e3df;
  pcStack_378 = (code *)0x13befd;
  uStack_368 = uVar6;
  uVar6 = bson_bcon_magic();
  pcStack_378 = (code *)0x13bf1b;
  uVar6 = bcon_new(0,"foo",uVar6,0x13,0);
  pcStack_378 = (code *)0x13bf23;
  uVar7 = bson_bcone_magic();
  pcStack_378 = (code *)0x13bf3b;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x13,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  pcStack_378 = test_minkey;
  test_maxkey_cold_1();
  pcStack_378 = (code *)0x13e3df;
  apcStack_390[0] = (code *)0x13bf5c;
  uStack_380 = uVar6;
  uVar6 = bson_bcon_magic();
  apcStack_390[0] = (code *)0x13bf7a;
  uVar6 = bcon_new(0,"foo",uVar6,0x14,0);
  apcStack_390[0] = (code *)0x13bf82;
  uVar7 = bson_bcone_magic();
  apcStack_390[0] = (code *)0x13bf9a;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x14,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  apcStack_390[0] = test_bson_document;
  test_minkey_cold_1();
  uStack_398 = 0;
  pcStack_3a0 = "foo";
  apcStack_588[0] = (code *)0x13bfe3;
  uStack_3b8 = uVar6;
  uStack_3b0 = uVar10;
  puStack_3a8 = puVar25;
  apcStack_390[0] = (code *)&stack0xffffffffffffff00;
  uVar9 = bcon_new(0,"bar","baz",0);
  apcStack_588[0] = (code *)0x13bfeb;
  uVar6 = bson_bcon_magic();
  pcVar27 = "foo";
  apcStack_588[0] = (code *)0x13c00c;
  uVar10 = bcon_new(0,"foo",uVar6,2,uVar9,0);
  apcStack_588[0] = (code *)0x13c014;
  uVar6 = bson_bcone_magic();
  apcStack_588[0] = (code *)0x13c034;
  cVar1 = bcon_extract(uVar10,"foo",uVar6,2,auStack_500,0);
  if (cVar1 == '\0') {
LAB_0013c1b7:
    apcStack_588[0] = (code *)0x13c1bc;
    test_bson_document_cold_1();
LAB_0013c1bc:
    apcStack_588[0] = (code *)0x13c1c1;
    test_bson_document_cold_6();
LAB_0013c1c1:
    apcStack_588[0] = (code *)0x13c1c6;
    test_bson_document_cold_5();
LAB_0013c1c6:
    apcStack_588[0] = (code *)0x13c1cb;
    test_bson_document_cold_2();
  }
  else {
    apcStack_588[0] = (code *)0x13c04c;
    pvVar8 = (void *)bson_get_data(auStack_500);
    apcStack_588[0] = (code *)0x13c057;
    pcVar27 = (char *)bson_get_data(uVar9);
    if (*(uint *)(uVar9 + 4) == uStack_4fc) {
      apcStack_588[0] = (code *)0x13c06b;
      pvVar11 = (void *)bson_get_data(uVar9);
      apcStack_588[0] = (code *)0x13c07b;
      pvVar12 = (void *)bson_get_data(auStack_500);
      apcStack_588[0] = (code *)0x13c089;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar9 + 4));
      if (iVar2 == 0) {
        apcStack_588[0] = (code *)0x13c09a;
        bson_destroy(auStack_500);
        apcStack_588[0] = (code *)0x13c0a2;
        bson_destroy(uVar9);
        apcStack_588[0] = (code *)0x13c0aa;
        bson_destroy(uVar10);
        return;
      }
    }
    puVar25 = auStack_500;
    apcStack_588[0] = (code *)0x13c0cb;
    uVar6 = bson_as_canonical_extended_json(puVar25);
    apcStack_588[0] = (code *)0x13c0d8;
    uVar7 = bson_as_canonical_extended_json(uVar9);
    uVar10 = 0xffffffff;
    if (uStack_4fc != 0) {
      uVar19 = 0;
      do {
        if (*(int *)(uVar9 + 4) == (int)uVar19) break;
        if (*(char *)((long)pvVar8 + uVar19) != pcVar27[uVar19]) {
          uVar10 = uVar19 & 0xffffffff;
          break;
        }
        uVar19 = uVar19 + 1;
      } while (uStack_4fc != (uint)uVar19);
    }
    if ((int)uVar10 == -1) {
      uVar3 = uStack_4fc;
      if (uStack_4fc < *(uint *)(uVar9 + 4)) {
        uVar3 = *(uint *)(uVar9 + 4);
      }
      uVar10 = (ulong)(uVar3 - 1);
    }
    apcStack_588[0] = (code *)0x13c133;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar10,uVar6,uVar7);
    apcStack_588[0] = (code *)0x13c14b;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    uVar10 = (ulong)uVar3;
    apcStack_588[0] = (code *)0x13c166;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_504 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013c1bc;
    puVar25 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013c1c1;
    uVar10 = (ulong)uStack_4fc;
    apcStack_588[0] = (code *)0x13c190;
    uVar19 = write(uVar3,pvVar8,uVar10);
    if (uVar19 != uVar10) goto LAB_0013c1c6;
    uVar9 = (ulong)*(uint *)(uVar9 + 4);
    apcStack_588[0] = (code *)0x13c1a6;
    uVar19 = write(uVar4,pcVar27,uVar9);
    if (uVar19 == uVar9) {
      apcStack_588[0] = (code *)0x13c1b7;
      test_bson_document_cold_4();
      goto LAB_0013c1b7;
    }
  }
  apcStack_588[0] = test_bson_array;
  test_bson_document_cold_3();
  pcStack_788 = (code *)0x13c201;
  uStack_5b0 = uVar9;
  uStack_5a8 = uVar10;
  puStack_5a0 = puVar25;
  pcStack_598 = pcVar27;
  pvStack_590 = pvVar8;
  apcStack_588[0] = (code *)apcStack_390;
  uVar9 = bcon_new(0,"0","baz",0);
  pcStack_788 = (code *)0x13c209;
  uVar6 = bson_bcon_magic();
  pcVar27 = "foo";
  pcStack_788 = (code *)0x13c22a;
  uVar10 = bcon_new(0,"foo",uVar6,3,uVar9,0);
  pcStack_788 = (code *)0x13c232;
  uVar6 = bson_bcone_magic();
  pcStack_788 = (code *)0x13c252;
  cVar1 = bcon_extract(uVar10,"foo",uVar6,3,auStack_700,0);
  if (cVar1 == '\0') {
LAB_0013c3d5:
    pcStack_788 = (code *)0x13c3da;
    test_bson_array_cold_1();
LAB_0013c3da:
    pcStack_788 = (code *)0x13c3df;
    test_bson_array_cold_6();
LAB_0013c3df:
    pcStack_788 = (code *)0x13c3e4;
    test_bson_array_cold_5();
LAB_0013c3e4:
    pcStack_788 = (code *)0x13c3e9;
    test_bson_array_cold_2();
  }
  else {
    pcStack_788 = (code *)0x13c26a;
    pvVar8 = (void *)bson_get_data(auStack_700);
    pcStack_788 = (code *)0x13c275;
    pcVar27 = (char *)bson_get_data(uVar9);
    if (*(uint *)(uVar9 + 4) == uStack_6fc) {
      pcStack_788 = (code *)0x13c289;
      pvVar11 = (void *)bson_get_data(uVar9);
      pcStack_788 = (code *)0x13c299;
      pvVar12 = (void *)bson_get_data(auStack_700);
      pcStack_788 = (code *)0x13c2a7;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar9 + 4));
      if (iVar2 == 0) {
        pcStack_788 = (code *)0x13c2b8;
        bson_destroy(auStack_700);
        pcStack_788 = (code *)0x13c2c0;
        bson_destroy(uVar9);
        pcStack_788 = (code *)0x13c2c8;
        bson_destroy(uVar10);
        return;
      }
    }
    puVar25 = auStack_700;
    pcStack_788 = (code *)0x13c2e9;
    uVar6 = bson_as_canonical_extended_json(puVar25);
    pcStack_788 = (code *)0x13c2f6;
    uVar7 = bson_as_canonical_extended_json(uVar9);
    uVar10 = 0xffffffff;
    if (uStack_6fc != 0) {
      uVar19 = 0;
      do {
        if (*(int *)(uVar9 + 4) == (int)uVar19) break;
        if (*(char *)((long)pvVar8 + uVar19) != pcVar27[uVar19]) {
          uVar10 = uVar19 & 0xffffffff;
          break;
        }
        uVar19 = uVar19 + 1;
      } while (uStack_6fc != (uint)uVar19);
    }
    if ((int)uVar10 == -1) {
      uVar3 = uStack_6fc;
      if (uStack_6fc < *(uint *)(uVar9 + 4)) {
        uVar3 = *(uint *)(uVar9 + 4);
      }
      uVar10 = (ulong)(uVar3 - 1);
    }
    pcStack_788 = (code *)0x13c351;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar10,uVar6,uVar7);
    pcStack_788 = (code *)0x13c369;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    uVar10 = (ulong)uVar3;
    pcStack_788 = (code *)0x13c384;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_704 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013c3da;
    puVar25 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013c3df;
    uVar10 = (ulong)uStack_6fc;
    pcStack_788 = (code *)0x13c3ae;
    uVar19 = write(uVar3,pvVar8,uVar10);
    if (uVar19 != uVar10) goto LAB_0013c3e4;
    uVar9 = (ulong)*(uint *)(uVar9 + 4);
    pcStack_788 = (code *)0x13c3c4;
    uVar19 = write(uVar4,pcVar27,uVar9);
    if (uVar19 == uVar9) {
      pcStack_788 = (code *)0x13c3d5;
      test_bson_array_cold_4();
      goto LAB_0013c3d5;
    }
  }
  pcStack_788 = test_inline_array;
  test_bson_array_cold_3();
  pcStack_7c0 = (code *)0x13c3fe;
  uStack_7b8 = extraout_RAX_03;
  uStack_7b0 = uVar9;
  uStack_7a8 = uVar10;
  puStack_7a0 = puVar25;
  pcStack_798 = pcVar27;
  pvStack_790 = pvVar8;
  pcStack_788 = (code *)apcStack_588;
  uStack_7e8 = bson_bcon_magic();
  pcStack_7c8 = (char *)0x0;
  pcStack_7d0 = "]";
  puStack_7d8 = (undefined1 *)0x2;
  uStack_7e0 = 0xf;
  uStack_7f0 = 0x13c446;
  uVar6 = bcon_new(0,"foo","[",uStack_7e8,0xf,1);
  pcStack_7c0 = (code *)0x13c452;
  uStack_7e8 = bson_bcone_magic();
  pcStack_7c8 = (char *)0x0;
  pcStack_7d0 = "]";
  uStack_7e0 = 0xf;
  uStack_7f0 = 0x13c481;
  puStack_7d8 = (undefined1 *)&uStack_7b8;
  cVar1 = bcon_extract(uVar6,"foo","[",uStack_7e8,0xf,(long)&uStack_7b8 + 4);
  if (cVar1 == '\0') {
    pcStack_7c0 = (code *)0x13c4b2;
    test_inline_array_cold_1();
LAB_0013c4b2:
    pcStack_7c0 = (code *)0x13c4b7;
    test_inline_array_cold_2();
  }
  else {
    if (uStack_7b8._4_4_ != 1) goto LAB_0013c4b2;
    if ((int)uStack_7b8 == 2) {
      pcStack_7c0 = (code *)0x13c49e;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_7c0 = test_inline_doc;
  test_inline_array_cold_3();
  pcStack_7c0 = (code *)0x147feb;
  pcStack_7c8 = "[";
  pcStack_7d0 = "foo";
  puStack_7d8 = (undefined1 *)0x0;
  uStack_7e0 = 0xf;
  pcStack_7f8 = (code *)0x13c4cc;
  uStack_7f0 = extraout_RAX_04;
  uStack_7e8 = uVar6;
  pcStack_820 = (char *)bson_bcon_magic();
  pcStack_800 = (char *)0x0;
  pcStack_808 = "}";
  pcStack_810 = (char *)0x1;
  pcStack_818 = (char *)0xf;
  uStack_828 = "a";
  uStack_830 = 2;
  uStack_838 = 0x13c51f;
  uVar6 = bcon_new(0,"foo","{","b",pcStack_820,0xf);
  pcStack_7f8 = (code *)0x13c52b;
  pcStack_820 = (char *)bson_bcone_magic();
  uStack_830 = (long)&uStack_7f0 + 4;
  pcStack_800 = (char *)0x0;
  pcStack_808 = "}";
  pcStack_818 = (char *)0xf;
  uStack_828 = "b";
  uStack_838 = 0x13c56e;
  pcStack_810 = (char *)&uStack_7f0;
  cVar1 = bcon_extract(uVar6,"foo","{","a",pcStack_820,0xf);
  if (cVar1 == '\0') {
    pcStack_7f8 = (code *)0x13c59f;
    test_inline_doc_cold_1();
LAB_0013c59f:
    pcStack_7f8 = (code *)0x13c5a4;
    test_inline_doc_cold_2();
  }
  else {
    if (uStack_7f0._4_4_ != 1) goto LAB_0013c59f;
    if ((int)uStack_7f0 == 2) {
      pcStack_7f8 = (code *)0x13c58b;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_7f8 = test_extract_ctx;
  test_inline_doc_cold_3();
  pcStack_7f8 = (code *)0x0;
  pcStack_800 = "a";
  pcStack_810 = "{";
  pcStack_818 = "foo";
  pcStack_820 = "}";
  pcStack_840 = (code *)0x13c5bc;
  pcStack_808 = (char *)uVar6;
  uStack_878 = (undefined8 *)bson_bcon_magic();
  pcStack_840 = (code *)0x0;
  pcStack_848 = (char *)0x3;
  pbStack_850 = (bson_t *)0xf;
  pcStack_860 = "c";
  pcStack_868 = (char *)0x2;
  pcStack_870 = (char *)0xf;
  uStack_880 = 0x13c5fe;
  uStack_858 = uStack_878;
  bson = (bson_t *)bcon_new(0,"a",uStack_878,0xf,1,"b");
  pcStack_840 = (code *)0x13c60a;
  pcStack_888 = (code *)bson_bcone_magic();
  pbStack_850 = (bson_t *)((long)&uStack_830 + 4);
  uStack_878 = &uStack_828;
  pcStack_848 = (char *)0x0;
  uStack_858 = 0xf;
  pcStack_868 = "c";
  pcStack_870 = (char *)0x0;
  uStack_880 = 0xf;
  pcStack_890 = "b";
  pcStack_898 = (char *)0x0;
  pcStack_8a0 = (char *)0x13c656;
  pcStack_860 = (char *)pcStack_888;
  test_extract_ctx_helper(bson,3,"a",pcStack_888,0xf,(long)&uStack_828 + 4);
  if (uStack_828._4_4_ == 1) {
    if ((int)uStack_828 != 2) goto LAB_0013c68b;
    if (uStack_830._4_4_ == 3) {
      pcStack_840 = (code *)0x13c677;
      bson_destroy(bson);
      return;
    }
  }
  else {
    pcStack_840 = (code *)0x13c68b;
    test_extract_ctx_cold_1();
LAB_0013c68b:
    pcStack_840 = (code *)0x13c690;
    test_extract_ctx_cold_2();
  }
  pcStack_840 = test_nested;
  test_extract_ctx_cold_3();
  pcStack_840 = (code *)0xf;
  pcStack_848 = "a";
  uStack_858 = 0;
  pcStack_868 = "c";
  pcStack_888 = (code *)0x13c6a8;
  pcStack_860 = (char *)((long)&uStack_828 + 4);
  pbStack_850 = bson;
  uStack_8b0 = bson_bcon_magic();
  pcStack_890 = (char *)0x0;
  pcStack_898 = "}";
  pcStack_8a0 = (char *)0xa;
  pcStack_8a8 = (char *)0xf;
  pcStack_8b8 = (char *)0x13c6fd;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_888 = (code *)0x13c709;
  uStack_8b0 = bson_bcone_magic();
  pcStack_8a0 = (char *)((long)&uStack_878 + 4);
  pcStack_890 = (char *)0x0;
  pcStack_898 = "}";
  pcStack_8a8 = (char *)0xf;
  pcStack_8b8 = "bar";
  pcStack_8c0 = (code *)0x13f9a8;
  uStack_8c8 = 0x13c745;
  cVar1 = bcon_extract(uVar6,"hello",uStack_8b0,0,&pcStack_870,"foo");
  if (cVar1 == '\0') {
    pcStack_888 = (code *)0x13c785;
    test_nested_cold_1();
LAB_0013c785:
    pcStack_888 = (code *)0x13c78a;
    test_nested_cold_2();
  }
  else {
    pcStack_888 = (code *)0x13c75e;
    iVar2 = strcmp("world",pcStack_870);
    if (iVar2 != 0) goto LAB_0013c785;
    if (uStack_878._4_4_ == 10) {
      pcStack_888 = (code *)0x13c771;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_888 = test_skip;
  test_nested_cold_3();
  pcStack_888 = (code *)0x148ce7;
  pcStack_890 = "bar";
  pcStack_898 = (char *)0x0;
  pcStack_8a0 = "hello";
  pcStack_8a8 = "foo";
  pcStack_8c0 = (code *)0x13c79f;
  uStack_8b0 = uVar6;
  pcStack_8e8 = (char *)bson_bcon_magic();
  uStack_8c8 = 0;
  pcStack_8d0 = "}";
  pcStack_8d8 = (char *)0xa;
  pcStack_8e0 = (char *)0xf;
  pcStack_8f0 = (char *)0x13c7f2;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_8c0 = (code *)0x13c7fe;
  pcVar27 = (char *)bson_bcone_magic();
  pcVar26 = "}";
  uStack_8c8 = 0;
  pcStack_8d0 = "}";
  pcStack_8d8 = (char *)0x10;
  pcStack_8e0 = (char *)0x1c;
  pcStack_8f0 = "bar";
  pcStack_8f8 = "{";
  uStack_900 = 0x13c83a;
  pcStack_8e8 = pcVar27;
  cVar1 = bcon_extract(uVar6,"hello",pcVar27,0x1c,2);
  if (cVar1 == '\0') {
    pcStack_8c0 = (code *)0x13c89c;
    test_skip_cold_1();
  }
  else {
    uStack_8c8 = 0;
    pcStack_8d0 = "}";
    pcStack_8d8 = (char *)0x12;
    pcStack_8e0 = (char *)0x1c;
    pcStack_8f0 = "bar";
    pcStack_8f8 = "{";
    uStack_900 = 0x13c879;
    pcStack_8e8 = pcVar27;
    cVar1 = bcon_extract(uVar6,"hello",pcVar27,0x1c,2);
    if (cVar1 == '\0') {
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_8c0 = test_iter;
  test_skip_cold_2();
  pcStack_8c0 = (code *)0x14c89e;
  pcStack_8d0 = "bar";
  pcStack_8d8 = "}";
  pcStack_8e8 = "{";
  apcStack_a88[0] = (code *)0x13c8be;
  pcStack_8e0 = pcVar27;
  uStack_8c8 = uVar6;
  __buf = (char *)bson_bcon_magic();
  __n_00 = "foo";
  apcStack_a88[0] = (code *)0x13c8e5;
  __n = (char *)bcon_new(0,"foo",__buf,0xf,10);
  apcStack_a88[0] = (code *)0x13c8ed;
  uVar6 = bson_bcone_magic();
  pcVar13 = acStack_a00;
  pcVar20 = "foo";
  uVar7 = 0x1d;
  uVar23 = 0;
  apcStack_a88[0] = (code *)0x13c90d;
  pcVar21 = __n;
  cVar1 = bcon_extract(__n,"foo",uVar6);
  uVar6 = extraout_XMM1_Qa;
  if (cVar1 == '\0') {
LAB_0013cabc:
    apcStack_a88[0] = (code *)0x13cac1;
    test_iter_cold_1();
LAB_0013cac1:
    apcStack_a88[0] = (code *)0x13cac6;
    test_iter_cold_2();
LAB_0013cac6:
    apcStack_a88[0] = (code *)0x13cacb;
    test_iter_cold_3();
LAB_0013cacb:
    apcStack_a88[0] = (code *)0x13cad0;
    test_iter_cold_8();
LAB_0013cad0:
    apcStack_a88[0] = (code *)0x13cad5;
    test_iter_cold_7();
  }
  else {
    pcVar21 = acStack_a00;
    apcStack_a88[0] = (code *)0x13c922;
    iVar2 = bson_iter_type();
    uVar6 = extraout_XMM1_Qa_00;
    if (iVar2 != 0x10) goto LAB_0013cac1;
    pcVar21 = acStack_a00;
    apcStack_a88[0] = (code *)0x13c938;
    iVar2 = bson_iter_int32();
    uVar6 = extraout_XMM1_Qa_01;
    if (iVar2 != 10) goto LAB_0013cac6;
    uVar23 = 0;
    apcStack_a88[0] = (code *)0x13c964;
    __n_00 = (char *)bcon_new(0,"foo",__buf,0x1d,acStack_a00);
    apcStack_a88[0] = (code *)0x13c96f;
    pcVar27 = (char *)bson_get_data(__n_00);
    apcStack_a88[0] = (code *)0x13c97a;
    __buf = (char *)bson_get_data(__n);
    if (*(int *)(__n + 4) == *(int *)(__n_00 + 4)) {
      apcStack_a88[0] = (code *)0x13c98e;
      pvVar8 = (void *)bson_get_data(__n);
      apcStack_a88[0] = (code *)0x13c999;
      pvVar11 = (void *)bson_get_data(__n_00);
      apcStack_a88[0] = (code *)0x13c9a7;
      iVar2 = bcmp(pvVar8,pvVar11,(ulong)*(uint *)(__n + 4));
      if (iVar2 == 0) {
        apcStack_a88[0] = (code *)0x13c9b3;
        bson_destroy(__n);
        apcStack_a88[0] = (code *)0x13c9bb;
        bson_destroy(__n_00);
        return;
      }
    }
    apcStack_a88[0] = (code *)0x13c9d4;
    uVar7 = bson_as_canonical_extended_json(__n_00);
    apcStack_a88[0] = (code *)0x13c9e1;
    pcVar13 = (char *)bson_as_canonical_extended_json(__n);
    uVar3 = *(uint *)(__n_00 + 4);
    uVar9 = 0xffffffff;
    if (uVar3 != 0) {
      uVar10 = 0;
      do {
        if (*(int *)(__n + 4) == (int)uVar10) break;
        if (pcVar27[uVar10] != __buf[uVar10]) {
          uVar9 = uVar10 & 0xffffffff;
          break;
        }
        uVar10 = uVar10 + 1;
      } while (uVar3 != (uint)uVar10);
    }
    if ((int)uVar9 == -1) {
      if (uVar3 < *(uint *)(__n + 4)) {
        uVar3 = *(uint *)(__n + 4);
      }
      uVar9 = (ulong)(uVar3 - 1);
    }
    apcStack_a88[0] = (code *)0x13ca3c;
    uVar6 = extraout_XMM1_Qa_02;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar9);
    apcStack_a88[0] = (code *)0x13ca54;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar26 = (char *)(ulong)uVar3;
    pcVar21 = "failure.expected.bson";
    pcVar20 = (char *)0x42;
    apcStack_a88[0] = (code *)0x13ca6f;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_a04 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013cacb;
    if (uVar4 == 0xffffffff) goto LAB_0013cad0;
    pcVar26 = (char *)(ulong)uVar4;
    __n_00 = (char *)(ulong)*(uint *)(__n_00 + 4);
    pcVar21 = (char *)(ulong)uVar3;
    apcStack_a88[0] = (code *)0x13ca95;
    pcVar20 = pcVar27;
    pcVar14 = (char *)write(uVar3,pcVar27,(size_t)__n_00);
    if (pcVar14 == __n_00) {
      __n = (char *)(ulong)*(uint *)(__n + 4);
      apcStack_a88[0] = (code *)0x13caab;
      pcVar20 = __buf;
      pcVar21 = pcVar26;
      pcVar14 = (char *)write(uVar4,__buf,(size_t)__n);
      if (pcVar14 != __n) goto LAB_0013cada;
      pcVar21 = (char *)(ulong)uStack_a04;
      pcVar20 = (char *)(ulong)uVar4;
      apcStack_a88[0] = (code *)0x13cabc;
      test_iter_cold_6();
      goto LAB_0013cabc;
    }
  }
  apcStack_a88[0] = (code *)0x13cada;
  test_iter_cold_4();
LAB_0013cada:
  apcStack_a88[0] = test_extract_ctx_helper;
  test_iter_cold_5();
  puStack_70c0 = auStack_70b0;
  if (extraout_AL != '\0') {
    uStack_7070 = uVar6;
  }
  puStack_7108 = (undefined8 *)0x13cb62;
  pcStack_70a8 = pcVar20;
  uStack_7098 = uVar7;
  pcStack_7090 = pcVar13;
  uStack_7088 = uVar23;
  pcStack_aa8 = __n;
  pcStack_aa0 = pcVar27;
  pcStack_a98 = __buf;
  pcStack_a90 = __n_00;
  apcStack_a88[0] = (code *)&pcStack_8c0;
  bcon_extract_ctx_init(aDStack_7000);
  puStack_70c8 = auStack_a78;
  uStack_70d0 = 0x3000000010;
  uVar6 = 0x10;
  if (0 < (int)(uint)pcStack_70a8) {
    uVar3 = (uint)pcStack_70a8;
    do {
      puStack_7108 = (undefined8 *)0x13cbce;
      __s = aDStack_7000;
      pcVar27 = pcVar21;
      cVar1 = bcon_extract_ctx_va(pcVar21,aDStack_7000,&uStack_70d0);
      iVar2 = (int)uVar6;
      if (cVar1 == '\0') {
        puStack_7108 = (undefined8 *)0x13cbe9;
        test_extract_ctx_helper_cold_1();
        pcStack_7130 = (code *)0x13cc03;
        __name = __s;
        pcStack_7128 = pcVar21;
        uStack_7120 = (ulong)uVar3;
        pcStack_7118 = pcVar26;
        pDStack_7110 = aDStack_7000;
        puStack_7108 = &uStack_70d0;
        pcVar26 = (char *)strlen(pcVar27);
        pcStack_7130 = (code *)0x13cc0e;
        pDVar22 = __s;
        sVar15 = strlen((char *)__s);
        if ((int)sVar15 + (int)pcVar26 < 499) {
          pcStack_7130 = (code *)0x13cc2a;
          memset(__dest,0,500);
          pcStack_7130 = (code *)0x13cc38;
          strncat(__dest,pcVar27,(long)(int)pcVar26);
          pcStack_7130 = (code *)0x13cc40;
          sVar16 = strlen(__dest);
          (__dest + sVar16)[0] = '/';
          (__dest + sVar16)[1] = '\0';
          pcStack_7130 = (code *)0x13cc54;
          strncat(__dest,(char *)__s,(long)(int)sVar15);
          pcVar27 = __dest;
          do {
            if (*pcVar27 == '\\') {
              *pcVar27 = '/';
            }
            else if (*pcVar27 == '\0') {
              return;
            }
            pcVar27 = pcVar27 + 1;
          } while( true );
        }
        pcStack_7130 = collect_tests_from_dir;
        assemble_path_cold_1();
        uVar9 = (ulong)extraout_EDX;
        pDStack_73f8 = (DIR *)0x13cc9e;
        __filename = __name;
        iStack_73ec = iVar2;
        sStack_7150 = sVar15;
        pcStack_7148 = pcVar26;
        pDStack_7140 = __s;
        pcStack_7138 = pcVar27;
        pcStack_7130 = (code *)apcStack_a88;
        __dirp = opendir((char *)__name);
        pDVar24 = pDVar22;
        pDStack_7400 = __s;
        if (__dirp == (DIR *)0x0) goto LAB_0013cdc9;
        pDStack_73f8 = (DIR *)0x13ccb2;
        __filename = __dirp;
        pdVar17 = readdir(__dirp);
        if (pdVar17 == (dirent *)0x0) goto LAB_0013cda8;
        pcVar26 = "..";
        pDVar24 = (DIR *)0x147699;
        pDStack_73e8 = pDVar22;
        goto LAB_0013ccd1;
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
LAB_0013cd12:
  pDStack_73f8 = (DIR *)0x13cd25;
  assemble_path((char *)__name,pcVar27,acStack_7350);
  pDStack_73f8 = (DIR *)0x13cd32;
  iVar5 = stat(pcVar27,&sStack_73e0);
  if ((iVar5 == 0) && ((sStack_73e0.st_mode & 0xf000) == 0x4000)) {
    pDStack_73f8 = (DIR *)0x13cd60;
    uVar3 = collect_tests_from_dir((char (*) [500])pDStack_73e8,acStack_7350,iVar2,iStack_73ec);
    uVar9 = (ulong)uVar3;
  }
  else {
    pDStack_73f8 = (DIR *)0x13cd73;
    pcVar13 = strstr(pcVar27,".json");
    if (pcVar13 != (char *)0x0) {
      uVar9 = (ulong)(iVar2 + 1);
      pDStack_73f8 = (DIR *)0x13cd94;
      assemble_path((char *)__name,pcVar27,(char *)(pDStack_73e8 + (long)iVar2 * 500));
    }
  }
  pDStack_73f8 = (DIR *)0x13cd9c;
  __filename = __dirp;
  pdVar17 = readdir(__dirp);
  if (pdVar17 == (dirent *)0x0) {
LAB_0013cda8:
    pDStack_73f8 = (DIR *)0x13cdb0;
    closedir(__dirp);
    return;
  }
LAB_0013ccd1:
  iVar2 = (int)uVar9;
  if (iVar2 < iStack_73ec) {
    do {
      pcVar27 = pdVar17->d_name;
      pDStack_73f8 = (DIR *)0x13ccea;
      iVar5 = strcmp(pcVar27,"..");
      if (iVar5 != 0) {
        pDStack_73f8 = (DIR *)0x13ccf9;
        iVar5 = strcmp(pcVar27,".");
        if (iVar5 != 0) goto LAB_0013cd12;
      }
      pDStack_73f8 = (DIR *)0x13cd05;
      pdVar17 = readdir(__dirp);
      if (pdVar17 == (dirent *)0x0) goto LAB_0013cda8;
    } while( true );
  }
  pDStack_73f8 = (DIR *)0x13cdc9;
  collect_tests_from_dir_cold_1();
  pDStack_7400 = __dirp;
LAB_0013cdc9:
  pDStack_73f8 = (DIR *)get_bson_from_json_file;
  collect_tests_from_dir_cold_2();
  uStack_7418 = uVar9;
  pDStack_7410 = pDVar24;
  pcStack_7408 = pcVar26;
  pDStack_73f8 = __name;
  __stream = fopen((char *)__filename,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar15 = ftell(__stream);
    fseek(__stream,0,0);
    if (0 < (long)sVar15) {
      pvVar8 = (void *)bson_malloc0(sVar15);
      sVar16 = fread(pvVar8,1,sVar15,__stream);
      if (sVar16 != sVar15) {
        abort();
      }
      fclose(__stream);
      if (pvVar8 != (void *)0x0) {
        lVar18 = bson_new_from_json(pvVar8,sVar15,auStack_7618);
        if (lVar18 == 0) {
          fprintf(_stderr,"Cannot parse %s: %s\n",__filename,auStack_7610);
          abort();
        }
        bson_free(pvVar8);
      }
    }
  }
  return;
}

Assistant:

static void
test_bool (void)
{
   bson_t bcon, expected;

   bson_init (&bcon);
   bson_init (&expected);

   bson_append_bool (&expected, "foo", -1, 1);

   BCON_APPEND (&bcon, "foo", BCON_BOOL (1));

   bson_eq_bson (&bcon, &expected);

   bson_reinit (&bcon);
   bson_reinit (&expected);

   bson_append_bool (&expected, "foo", -1, 0);

   BCON_APPEND (&bcon, "foo", BCON_BOOL (0));

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}